

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

string * __thiscall
hgdb::json::SymbolTable::output_abi_cxx11_(string *__return_storage_ptr__,SymbolTable *this)

{
  bool bVar1;
  JSONWriter *pJVar2;
  size_type sVar3;
  reference pbVar4;
  pointer pMVar5;
  string_view local_2d8;
  reference local_2c8;
  Variable *v;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_> *__range3_1;
  reference local_298;
  unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  reference local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n;
  iterator __end3;
  iterator __begin3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string_view local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string_view local_1c0 [2];
  undefined1 local_1a0 [8];
  JSONWriter w;
  SymbolTable *this_local;
  
  w._384_8_ = this;
  JSONWriter::JSONWriter((JSONWriter *)local_1a0);
  JSONWriter::begin_obj((JSONWriter *)local_1a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_1c0,"generator");
  pJVar2 = JSONWriter::key((JSONWriter *)local_1a0,local_1c0[0]);
  std::__cxx11::string::string((string *)&local_1e0,(string *)this);
  JSONWriter::value<std::__cxx11::string>(pJVar2,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  sVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->top_names_);
  if (sVar3 == 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f0,"top");
    pJVar2 = JSONWriter::key((JSONWriter *)local_1a0,local_1f0);
    local_218._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->top_names_);
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_218);
    std::__cxx11::string::string((string *)&local_210,(string *)pbVar4);
    JSONWriter::value<std::__cxx11::string>(pJVar2,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"top");
    pJVar2 = JSONWriter::key((JSONWriter *)local_1a0,___range3);
    JSONWriter::begin_array(pJVar2);
    __end3 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->top_names_);
    n = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->top_names_);
    while( true ) {
      bVar1 = std::operator!=(&__end3,(_Self *)&n);
      if (!bVar1) break;
      local_248 = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end3);
      std::__cxx11::string::string((string *)&local_268,(string *)local_248);
      JSONWriter::value<std::__cxx11::string>((JSONWriter *)local_1a0,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
    JSONWriter::end_array((JSONWriter *)local_1a0);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"table");
  pJVar2 = JSONWriter::key((JSONWriter *)local_1a0,___range2);
  JSONWriter::begin_array(pJVar2);
  __end2 = std::
           vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ::begin(&this->modules_);
  m = (unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *)
      std::
      vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
      ::end(&this->modules_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_*,_std::vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>_>
                                *)&m);
    if (!bVar1) break;
    local_298 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_*,_std::vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>_>
                ::operator*(&__end2);
    pMVar5 = std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>::
             operator->(local_298);
    (**(pMVar5->super_Scope<hgdb::json::Module>).super_ScopeBase._vptr_ScopeBase)(pMVar5,local_1a0);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_*,_std::vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>_>
    ::operator++(&__end2);
  }
  JSONWriter::end_array((JSONWriter *)local_1a0);
  bVar1 = std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>::empty
                    (&this->variables_);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3_1,"variables");
    JSONWriter::key((JSONWriter *)local_1a0,___range3_1);
    JSONWriter::begin_array((JSONWriter *)local_1a0);
    __end3_1 = std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>::begin
                         (&this->variables_);
    v = (Variable *)
        std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>::end
                  (&this->variables_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3_1,
                         (__normal_iterator<const_hgdb::json::Variable_*,_std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>_>
                          *)&v);
      if (!bVar1) break;
      local_2c8 = __gnu_cxx::
                  __normal_iterator<const_hgdb::json::Variable_*,_std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>_>
                  ::operator*(&__end3_1);
      Variable::serialize(local_2c8,(JSONWriter *)local_1a0);
      __gnu_cxx::
      __normal_iterator<const_hgdb::json::Variable_*,_std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>_>
      ::operator++(&__end3_1);
    }
    JSONWriter::end_array((JSONWriter *)local_1a0);
  }
  if ((this->reorder_ & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d8,"reorder");
    pJVar2 = JSONWriter::key((JSONWriter *)local_1a0,local_2d8);
    JSONWriter::value<bool>(pJVar2,false);
  }
  JSONWriter::end_obj((JSONWriter *)local_1a0);
  JSONWriter::str_abi_cxx11_(__return_storage_ptr__,(JSONWriter *)local_1a0);
  JSONWriter::~JSONWriter((JSONWriter *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string output() const {
        JSONWriter w;
        w.begin_obj();
        w.key("generator").value(framework_name_);

        if (top_names_.size() == 1) {
            w.key("top").value(*top_names_.begin());
        } else {
            w.key("top").begin_array();
            for (auto const &n : top_names_) w.value(n);
            w.end_array();
        }

        w.key("table").begin_array();
        for (auto const &m : modules_) {
            m->serialize(w);
        }
        w.end_array();

        if (!variables_.empty()) {
            w.key("variables");
            w.begin_array();
            for (auto const &v : variables_) {
                v.serialize(w);
            }
            w.end_array();
        }

        // attributes
        if (!reorder_) {
            w.key("reorder").value(false);
        }

        w.end_obj();
        return w.str();
    }